

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::
Own<kj::_::TransformPromiseNode<int,_int,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:690:26),_kj::_::PropagateException>_>
::dispose(Own<kj::_::TransformPromiseNode<int,_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:690:26),_kj::_::PropagateException>_>
          *this)

{
  TransformPromiseNode<int,_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:690:26),_kj::_::PropagateException>
  *object;
  TransformPromiseNode<int,_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:690:26),_kj::_::PropagateException>
  *ptrCopy;
  Own<kj::_::TransformPromiseNode<int,_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:690:26),_kj::_::PropagateException>_>
  *this_local;
  
  object = this->ptr;
  if (object != (TransformPromiseNode<int,_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:690:26),_kj::_::PropagateException>
                 *)0x0) {
    this->ptr = (TransformPromiseNode<int,_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:690:26),_kj::_::PropagateException>
                 *)0x0;
    Disposer::
    dispose<kj::_::TransformPromiseNode<int,int,kj::(anonymous_namespace)::TestCase679::run()::__1,kj::_::PropagateException>>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }